

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Image::drawOnto(Image *this,Image *image,Point point,Point sourcePoint,Size section)

{
  undefined1 uVar1;
  undefined1 uVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Color *pCVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int *in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  int x;
  int y;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Image *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar4;
  undefined4 in_stack_ffffffffffffff38;
  int iVar5;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_a0 [35];
  undefined1 local_7d;
  string local_48 [48];
  undefined8 local_18;
  int local_10;
  int iStack_c;
  int local_8;
  int iStack_4;
  
  local_10 = (int)in_RCX;
  local_18._0_4_ = (int)in_R8;
  if ((*in_RDI < local_10 + (int)local_18) ||
     (iStack_c = (int)((ulong)in_RCX >> 0x20), local_18._4_4_ = (int)((ulong)in_R8 >> 0x20),
     in_RDI[1] < iStack_c + local_18._4_4_)) {
    local_7d = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,
               (char *)CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,
                                         CONCAT24(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38))),
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    std::operator+(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00);
    std::runtime_error::runtime_error(this_00,local_48);
    local_7d = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_8 = (int)in_RDX;
  if ((local_8 + (int)local_18 <= *in_RSI) &&
     (iStack_4 = (int)((ulong)in_RDX >> 0x20), iStack_4 + local_18._4_4_ <= in_RSI[1])) {
    local_18 = in_R8;
    for (iVar5 = 0; iVar5 < local_18._4_4_; iVar5 = iVar5 + 1) {
      for (iVar4 = 0; iVar4 < (int)local_18; iVar4 = iVar4 + 1) {
        in_stack_ffffffffffffff00 =
             (Image *)pixel(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                            in_stack_fffffffffffffef8);
        pCVar3 = pixel(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                      );
        uVar6 = *(undefined1 *)((long)&(in_stack_ffffffffffffff00->size).width + 1);
        uVar1 = *(undefined1 *)((long)&(in_stack_ffffffffffffff00->size).width + 2);
        uVar2 = *(undefined1 *)((long)&(in_stack_ffffffffffffff00->size).width + 3);
        pCVar3->r = *(undefined1 *)&(in_stack_ffffffffffffff00->size).width;
        pCVar3->g = uVar6;
        pCVar3->b = uVar1;
        pCVar3->a = uVar2;
      }
    }
    return;
  }
  uVar6 = 1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff3c,
                                                      in_stack_ffffffffffffff38))),
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
  std::runtime_error::runtime_error((runtime_error *)__lhs,local_a0);
  __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::drawOnto(Image &image, Point point, Point sourcePoint, Size section) const {
	throwing_assert(sourcePoint.x + section.width <= size.width && sourcePoint.y + section.height <= size.height);
	throwing_assert(point.x + section.width <= image.size.width && point.y + section.height <= image.size.height);

	for (int y = 0; y < section.height; y++) {
		for (int x = 0; x < section.width; x++) {
			image.pixel(x + point.x, y + point.y) = this->pixel(x + sourcePoint.x, y + sourcePoint.y);
		}
	}
}